

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.cpp
# Opt level: O3

int duckdb_brotli::BrotliWarmupBitReader(BrotliBitReader *br)

{
  byte *pbVar1;
  
  if (br->bit_pos_ != 0) {
    return 1;
  }
  br->val_ = 0;
  pbVar1 = br->next_in;
  if (pbVar1 != br->last_in) {
    br->val_ = (ulong)*pbVar1;
    br->bit_pos_ = 8;
    br->next_in = pbVar1 + 1;
    return 1;
  }
  return 0;
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliWarmupBitReader(BrotliBitReader* const br) {
  size_t aligned_read_mask = (sizeof(br->val_) >> 1) - 1;
  /* Fixing alignment after unaligned BrotliFillWindow would result accumulator
     overflow. If unalignment is caused by BrotliSafeReadBits, then there is
     enough space in accumulator to fix alignment. */
  if (BROTLI_UNALIGNED_READ_FAST) {
    aligned_read_mask = 0;
  }
  if (BrotliGetAvailableBits(br) == 0) {
    br->val_ = 0;
    if (!BrotliPullByte(br)) {
      return BROTLI_FALSE;
    }
  }

  while ((((size_t)br->next_in) & aligned_read_mask) != 0) {
    if (!BrotliPullByte(br)) {
      /* If we consumed all the input, we don't care about the alignment. */
      return BROTLI_TRUE;
    }
  }
  return BROTLI_TRUE;
}